

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O0

void zmq::enable_ipv4_mapping(fd_t s_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_EDI;
  char *errstr;
  int rc;
  int flag;
  undefined4 local_8 [2];
  
  local_8[0] = 0;
  iVar1 = setsockopt(in_EDI,0x29,0x1a,local_8,4);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip.cpp"
            ,0xa4);
    fflush(_stderr);
    zmq_abort((char *)0x2b47e3);
  }
  return;
}

Assistant:

void zmq::enable_ipv4_mapping (fd_t s_)
{
    LIBZMQ_UNUSED (s_);

#if defined IPV6_V6ONLY && !defined ZMQ_HAVE_OPENBSD                           \
  && !defined ZMQ_HAVE_DRAGONFLY
#ifdef ZMQ_HAVE_WINDOWS
    DWORD flag = 0;
#else
    int flag = 0;
#endif
    const int rc = setsockopt (s_, IPPROTO_IPV6, IPV6_V6ONLY,
                               reinterpret_cast<char *> (&flag), sizeof (flag));
#ifdef ZMQ_HAVE_WINDOWS
    wsa_assert (rc != SOCKET_ERROR);
#else
    errno_assert (rc == 0);
#endif
#endif
}